

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hh
# Opt level: O3

void __thiscall
tchecker::refzg::details::
state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>::
share(state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
      *this,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
            *p)

{
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>
  *piVar1;
  overflow_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>
  *piVar3;
  pair<std::__detail::_Node_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_true,_true>,_bool>
  pVar4;
  __node_gen_type __node_gen;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>
  local_28;
  hashtable_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  *local_20;
  
  ta::details::
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>::
  share(&this->
         super_state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
        ,p);
  if (p->_t != (make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL> *)0x0) {
    piVar3 = &(p->_t->super_state_t)._zone;
    local_20 = &(((this->_zone_cache).
                  super___shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->
                super_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
                )._hashtable;
    pVar4 = std::
            _Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,unsigned_long,1ul>>>,std::__detail::_Identity,tchecker::intrusive_shared_ptr_delegate_equal_to_t,tchecker::intrusive_shared_ptr_delegate_hash_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,unsigned_long,1ul>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,unsigned_long,1ul>>,true>>>>
                      ((_Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,unsigned_long,1ul>>>,std::__detail::_Identity,tchecker::intrusive_shared_ptr_delegate_equal_to_t,tchecker::intrusive_shared_ptr_delegate_hash_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_20,piVar3);
    piVar1 = (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>
              *)((long)pVar4.first.
                       super__Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_true>
                       ._M_cur.
                       super__Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_true>
                + 8);
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      piVar1 = piVar3;
    }
    local_28._t = piVar1->_t;
    if (local_28._t != (make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL> *)0x0) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(local_28._t[-1].super_zone_t._ref_clocks.
                        super___shared_ptr<const_tchecker::reference_clock_variables_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
      local_28._t[-1].super_zone_t._ref_clocks.
      super___shared_ptr<const_tchecker::reference_clock_variables_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var2;
      if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xfffffffffffffffe) {
        this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error(this_00,"reference counter overflow");
        __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
      }
    }
    if (p->_t != (make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL> *)0x0) {
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>
      ::operator=(&(p->_t->super_state_t)._zone,&local_28);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_28);
      return;
    }
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1db,
                "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::state_t>>::operator->() const [T = tchecker::make_shared_t<tchecker::refzg::state_t>]"
               );
}

Assistant:

void share(tchecker::intrusive_shared_ptr_t<STATE> const & p)
  {
    tchecker::ta::details::state_pool_allocator_t<STATE>::share(p);
    p->zone_ptr() = _zone_cache->find_else_add(p->zone_ptr());
  }